

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::ProcessIncidentEdges
          (Impl *this,ShapeEdge *a,S2ContainsPointQuery<S2ShapeIndex> *query,CrossingProcessor *cp)

{
  pointer pIVar1;
  pointer pIVar2;
  ShapeEdgeId a_id;
  byte bVar3;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  _Var4;
  CrossingIterator next_crossing;
  
  pIVar1 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tmp_crossings_).
      super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
    (this->tmp_crossings_).
    super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  next_crossing._24_8_ =
       std::
       _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1851:37)>
       ::_M_invoke;
  next_crossing.b_shape_ =
       (S2Shape *)
       std::
       _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1851:37)>
       ::_M_manager;
  next_crossing.b_index_ = (S2ShapeIndex *)a;
  next_crossing.it_._M_current = (IndexCrossing *)this;
  S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
            (query,&(a->edge_).v0,(EdgeVisitor *)&next_crossing);
  std::_Function_base::~_Function_base((_Function_base *)&next_crossing);
  pIVar1 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 == pIVar2) {
    bVar3 = cp->inside_ ^ 1;
  }
  else {
    if (1 < (ulong)(((long)pIVar2 - (long)pIVar1) / 0x14)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar1,pIVar2,((long)pIVar2 - (long)pIVar1) % 0x14);
      _Var4 = std::
              __adjacent_find<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        ((this->tmp_crossings_).
                         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->tmp_crossings_).
                         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      if (_Var4._M_current !=
          (this->tmp_crossings_).
          super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&next_crossing,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x749,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)next_crossing.it_._M_current,
                        "Check failed: std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) == tmp_crossings_.end() "
                       );
        abort();
      }
    }
    next_crossing.b_index_ = (S2ShapeIndex *)kSentinel;
    next_crossing.it_._M_current = (IndexCrossing *)kSentinel;
    next_crossing.b_shape_ = (S2Shape *)((ulong)next_crossing.b_shape_ & 0xffffffffffffff00);
    std::
    vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
    ::emplace_back<S2BooleanOperation::Impl::IndexCrossing>
              (&this->tmp_crossings_,(IndexCrossing *)&next_crossing);
    CrossingIterator::CrossingIterator(&next_crossing,query->index_,&this->tmp_crossings_,false);
    a_id.shape_id = (a->id_).shape_id;
    a_id.edge_id = (a->id_).edge_id;
    bVar3 = CrossingProcessor::ProcessEdge(cp,a_id,&next_crossing);
  }
  return (bool)bVar3;
}

Assistant:

bool S2BooleanOperation::Impl::ProcessIncidentEdges(
    const ShapeEdge& a, S2ContainsPointQuery<S2ShapeIndex>* query,
    CrossingProcessor* cp) {
  tmp_crossings_.clear();
  query->VisitIncidentEdges(a.v0(), [&a, this](const ShapeEdge& b) {
      return AddIndexCrossing(a, b, false /*is_interior*/, &tmp_crossings_);
    });
  // Fast path for the common case where there are no incident edges.  We
  // return false (terminating early) if the first chain edge will be emitted.
  if (tmp_crossings_.empty()) {
    return !cp->inside();
  }
  // Otherwise we invoke the full CrossingProcessor logic to determine whether
  // the first chain edge will be emitted.
  if (tmp_crossings_.size() > 1) {
    std::sort(tmp_crossings_.begin(), tmp_crossings_.end());
    // VisitIncidentEdges() should not generate any duplicate values.
    S2_DCHECK(std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) ==
           tmp_crossings_.end());
  }
  tmp_crossings_.push_back(IndexCrossing(kSentinel, kSentinel));
  CrossingIterator next_crossing(&query->index(), &tmp_crossings_,
                                 false /*crossings_complete*/);
  return cp->ProcessEdge(a.id(),  &next_crossing);
}